

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DeleteColumnNames(sqlite3 *db,Table *pTable)

{
  Column *local_28;
  Column *pCol;
  int i;
  Table *pTable_local;
  sqlite3 *db_local;
  
  local_28 = pTable->aCol;
  if (local_28 != (Column *)0x0) {
    for (pCol._4_4_ = 0; pCol._4_4_ < pTable->nCol; pCol._4_4_ = pCol._4_4_ + 1) {
      sqlite3DbFree(db,local_28->zCnName);
      local_28 = local_28 + 1;
    }
    sqlite3DbNNFreeNN(db,pTable->aCol);
    if (pTable->eTabType == '\0') {
      sqlite3ExprListDelete(db,(pTable->u).tab.pDfltList);
    }
    if (db->pnBytesFreed == (int *)0x0) {
      pTable->aCol = (Column *)0x0;
      pTable->nCol = 0;
      if (pTable->eTabType == '\0') {
        (pTable->u).tab.pDfltList = (ExprList *)0x0;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteColumnNames(sqlite3 *db, Table *pTable){
  int i;
  Column *pCol;
  assert( pTable!=0 );
  assert( db!=0 );
  if( (pCol = pTable->aCol)!=0 ){
    for(i=0; i<pTable->nCol; i++, pCol++){
      assert( pCol->zCnName==0 || pCol->hName==sqlite3StrIHash(pCol->zCnName) );
      sqlite3DbFree(db, pCol->zCnName);
    }
    sqlite3DbNNFreeNN(db, pTable->aCol);
    if( IsOrdinaryTable(pTable) ){
      sqlite3ExprListDelete(db, pTable->u.tab.pDfltList);
    }
    if( db->pnBytesFreed==0 ){
      pTable->aCol = 0;
      pTable->nCol = 0;
      if( IsOrdinaryTable(pTable) ){
        pTable->u.tab.pDfltList = 0;
      }
    }
  }
}